

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Warfare_Header::Warfare_Header
          (Warfare_Header *this,EntityIdentifier *FiringEntID,EntityIdentifier *TargetEntID,
          EntityIdentifier *MunitionID,EntityIdentifier *EventID)

{
  EntityIdentifier *EventID_local;
  EntityIdentifier *MunitionID_local;
  EntityIdentifier *TargetEntID_local;
  EntityIdentifier *FiringEntID_local;
  Warfare_Header *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Warfare_Header_0032fd60;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_FiringEntityID,FiringEntID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TargetEntityID,TargetEntID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_MunitionID,MunitionID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID,EventID);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x02';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Warfare_Header::Warfare_Header( const EntityIdentifier & FiringEntID, const EntityIdentifier & TargetEntID, const EntityIdentifier & MunitionID, const EntityIdentifier & EventID ) :
    m_FiringEntityID( FiringEntID ),
    m_TargetEntityID( TargetEntID ),
    m_MunitionID( MunitionID ),
    m_EventID( EventID )
{
    m_ui8ProtocolFamily = Warfare;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}